

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O0

char * lj_strfmt_wint(char *p,int32_t k)

{
  uint uVar1;
  uint32_t d_6;
  uint32_t d_5;
  uint32_t d_4;
  uint32_t d_3;
  uint32_t d_2;
  uint32_t d_1;
  uint32_t d;
  uint32_t w;
  uint32_t v;
  uint32_t u;
  int32_t k_local;
  char *p_local;
  
  w = k;
  _u = p;
  if (k < 0) {
    w = -k;
    _u = p + 1;
    *p = '-';
  }
  if (w < 10000) {
    if (w < 10) goto LAB_0012223b;
    if (99 < w) {
      if (999 < w) goto LAB_001221a8;
      goto LAB_001221dd;
    }
  }
  else {
    d = w / 10000;
    w = w % 10000;
    if (d < 10000) {
      if (9 < d) {
        if (99 < d) {
          if (999 < d) goto LAB_001220fc;
          goto LAB_00122131;
        }
        goto LAB_00122160;
      }
    }
    else {
      d_1 = d / 10000;
      d = d % 10000;
      if (9 < d_1) {
        uVar1 = d_1 / 10;
        d_1 = d_1 % 10;
        *_u = (char)uVar1 + '0';
        _u = _u + 1;
      }
      *_u = (char)d_1 + '0';
      _u = _u + 1;
LAB_001220fc:
      uVar1 = d * 0x20c5 >> 0x17;
      d = d + uVar1 * -1000;
      *_u = (char)uVar1 + '0';
      _u = _u + 1;
LAB_00122131:
      uVar1 = d * 0x29 >> 0xc;
      d = d + uVar1 * -100;
      *_u = (char)uVar1 + '0';
      _u = _u + 1;
LAB_00122160:
      uVar1 = d * 0x67 >> 10;
      d = d + uVar1 * -10;
      *_u = (char)uVar1 + '0';
      _u = _u + 1;
    }
    *_u = (char)d + '0';
    _u = _u + 1;
LAB_001221a8:
    uVar1 = w * 0x20c5 >> 0x17;
    w = w + uVar1 * -1000;
    *_u = (char)uVar1 + '0';
    _u = _u + 1;
LAB_001221dd:
    uVar1 = w * 0x29 >> 0xc;
    w = w + uVar1 * -100;
    *_u = (char)uVar1 + '0';
    _u = _u + 1;
  }
  uVar1 = w * 0x67 >> 10;
  w = w + uVar1 * -10;
  *_u = (char)uVar1 + '0';
  _u = _u + 1;
LAB_0012223b:
  *_u = (char)w + '0';
  return _u + 1;
}

Assistant:

char * LJ_FASTCALL lj_strfmt_wint(char *p, int32_t k)
{
  uint32_t u = (uint32_t)k;
  if (k < 0) { u = (uint32_t)-k; *p++ = '-'; }
  if (u < 10000) {
    if (u < 10) goto dig1;
    if (u < 100) goto dig2;
    if (u < 1000) goto dig3;
  } else {
    uint32_t v = u / 10000; u -= v * 10000;
    if (v < 10000) {
      if (v < 10) goto dig5;
      if (v < 100) goto dig6;
      if (v < 1000) goto dig7;
    } else {
      uint32_t w = v / 10000; v -= w * 10000;
      if (w >= 10) WINT_R(w, 10, 10)
      *p++ = (char)('0'+w);
    }
    WINT_R(v, 23, 1000)
    dig7: WINT_R(v, 12, 100)
    dig6: WINT_R(v, 10, 10)
    dig5: *p++ = (char)('0'+v);
  }
  WINT_R(u, 23, 1000)
  dig3: WINT_R(u, 12, 100)
  dig2: WINT_R(u, 10, 10)
  dig1: *p++ = (char)('0'+u);
  return p;
}